

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne.h
# Opt level: O1

uint __thiscall FastPForLib::ZRandom::getValue(ZRandom *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (this->nValues == 0) {
    this->MT[0x270] = this->MT[0];
    lVar2 = -0x9c0;
    do {
      uVar3 = *(uint *)((long)this->map + lVar2 + -4);
      uVar5 = (uVar3 & 0x7ffffffe | *(uint *)((long)this->map + lVar2 + -8) & 0x80000000) >> 1 ^
              **(uint **)((long)&this->nValues + lVar2 * 2);
      uVar4 = uVar5 ^ 0x9908b0df;
      if ((uVar3 & 1) == 0) {
        uVar4 = uVar5;
      }
      *(uint *)((long)this->map + lVar2 + -8) = uVar4;
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0);
    this->nValues = 0x270;
  }
  iVar1 = this->nValues;
  this->nValues = iVar1 + -1;
  uVar3 = *(uint *)((long)this + (0x270 - (long)iVar1) * 4);
  uVar3 = uVar3 >> 0xb ^ uVar3;
  uVar3 = (uVar3 & 0x13a58ad) << 7 ^ uVar3;
  uVar3 = (uVar3 & 0x1df8c) << 0xf ^ uVar3;
  return uVar3 >> 0x12 ^ uVar3;
}

Assistant:

unsigned int ZRandom::getValue() {
  if (0 == nValues) {
    MT[N] = MT[0];
    for (int i = 0; i < N; ++i) {
      unsigned y = (0x80000000 & MT[i]) | (0x7FFFFFFF & MT[i + 1]);
      unsigned v = *(map[i]) ^ (y >> 1);
      if (1 & y)
        v ^= 2567483615;
      MT[i] = v;
    }
    nValues = N;
  }
  unsigned y = MT[N - nValues--];
  y ^= y >> 11;
  y ^= (y << 7) & 2636928640U;
  y ^= (y << 15) & 4022730752U;
  y ^= y >> 18;
  return y;
}